

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivfdec.c
# Opt level: O2

int file_is_ivf(AvxInputContext *input_ctx)

{
  size_t sVar1;
  int iVar2;
  ulong uVar3;
  uchar raw_hdr [32];
  
  iVar2 = 1;
  sVar1 = buffer_input(input_ctx,0x20,raw_hdr,true);
  if ((sVar1 == 0x20) && (raw_hdr._0_4_ == 0x46494b44)) {
    if (raw_hdr._4_2_ != 0) {
      fwrite("Error: Unrecognized IVF version! This file may not decode properly.\n",0x44,1,_stderr)
      ;
    }
    input_ctx->fourcc = raw_hdr._8_4_;
    uVar3 = (ulong)(CONCAT24(SUB42(raw_hdr._12_4_,2),raw_hdr._12_4_) & 0xffff0000ffff);
    input_ctx->width = (int)uVar3;
    input_ctx->height = (int)(uVar3 >> 0x20);
    (input_ctx->framerate).numerator = raw_hdr._16_4_;
    (input_ctx->framerate).denominator = raw_hdr._20_4_;
    if (raw_hdr._16_4_ - 1000 < 0xfffffc19 || raw_hdr._20_4_ + 0xc4653600 < 0xc4653601) {
      (input_ctx->framerate).numerator = 0x1e;
      (input_ctx->framerate).denominator = 1;
    }
  }
  else {
    rewind_detect(input_ctx);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int file_is_ivf(struct AvxInputContext *input_ctx) {
  unsigned char raw_hdr[32];
  int is_ivf = 0;

  if (buffer_input(input_ctx, 32, raw_hdr, /*buffered=*/true) == 32) {
    if (memcmp(IVF_SIGNATURE, raw_hdr, 4) == 0) {
      is_ivf = 1;

      if (mem_get_le16(raw_hdr + 4) != 0) {
        fprintf(stderr,
                "Error: Unrecognized IVF version! This file may not"
                " decode properly.\n");
      }

      input_ctx->fourcc = mem_get_le32(raw_hdr + 8);
      input_ctx->width = mem_get_le16(raw_hdr + 12);
      input_ctx->height = mem_get_le16(raw_hdr + 14);
      input_ctx->framerate.numerator = mem_get_le32(raw_hdr + 16);
      input_ctx->framerate.denominator = mem_get_le32(raw_hdr + 20);
      fix_framerate(&input_ctx->framerate.numerator,
                    &input_ctx->framerate.denominator);
    }
  }

  if (!is_ivf) {
    rewind_detect(input_ctx);
  }
  return is_ivf;
}